

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O0

void __thiscall BasicBlock::MergePredBlocksValueMaps(BasicBlock *this,GlobOpt *globOpt)

{
  SymTable *pSVar1;
  Loop *pLVar2;
  code *pcVar3;
  PathDependentInfoToRestore infoToRestore;
  FlowEdge **ppFVar4;
  bool bVar5;
  SymID SVar8;
  int iVar11;
  uint uVar12;
  undefined4 *puVar13;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *pSVar14;
  Type_conflict pSVar15;
  BOOLEAN BVar6;
  bool bVar7;
  uint functionId;
  uint uVar9;
  uint uVar10;
  BailOutInfo *pBVar16;
  StackSym *pSVar17;
  Value *pVVar18;
  ValueInfo *pVVar19;
  StackSym *pSVar20;
  BasicBlock *pBVar21;
  BasicBlock *pBVar22;
  Type *ppFVar23;
  Type *ppFVar24;
  JitArenaAllocator *pJVar25;
  BVSparse<Memory::JitArenaAllocator> *pBVar26;
  BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *pSVar27;
  Iterator IVar28;
  PathDependentInfoToRestore PVar29;
  Iterator IVar30;
  BVSparse<Memory::JitArenaAllocator> *local_5c8;
  BVSparse<Memory::JitArenaAllocator> *local_5b8;
  TrackAllocData local_500;
  code *local_4d8;
  undefined8 local_4d0;
  TrackAllocData local_4c8;
  code *local_4a0;
  undefined8 local_498;
  TrackAllocData local_490;
  code *local_468;
  undefined8 local_460;
  TrackAllocData local_458;
  code *local_430;
  undefined8 local_428;
  TrackAllocData local_420;
  code *local_3f8;
  undefined8 local_3f0;
  TrackAllocData local_3e8;
  Loop *local_3c0;
  Loop *loop_1;
  BasicBlock *pred_2;
  FlowEdge **edge_1;
  Iterator __iter_1;
  BasicBlock *airlockBlock;
  BasicBlock *pBStack_388;
  bool symIVNeedsSpecializing;
  BasicBlock *orgPred;
  BasicBlock *pred_1;
  FlowEdge **edge;
  EditingIterator iter;
  BVSparse<Memory::JitArenaAllocator> symsNeedingFloatConversion;
  BVSparse<Memory::JitArenaAllocator> symsNeedingLosslessIntConversion;
  BVSparse<Memory::JitArenaAllocator> symsNeedingLossyIntConversion;
  ValueInfo *valueInfo_2;
  Value *value_2;
  StackSym *typeSpecSym;
  StackSym *varSym_1;
  SparseBVUnit _unit_2;
  BVIndex _startIndex_2;
  BVIndex _offset_2;
  BVSparseNode<Memory::JitArenaAllocator> *_curNode_2;
  BVIndex id_2;
  GlobOptBlockData *landingPadBlockData;
  ValueInfo *valueInfo_1;
  Value *value_1;
  StackSym *varSym;
  SparseBVUnit _unit_1;
  BVIndex _startIndex_1;
  BVIndex _offset_1;
  BVSparseNode<Memory::JitArenaAllocator> *_curNode_1;
  BVIndex id_1;
  JitArenaAllocator *alloc;
  SymTable *symTable_1;
  Loop *loop;
  BVSparse<Memory::JitArenaAllocator> *tempBv;
  ValueInfo *valueInfo;
  Value *value;
  Sym *sym;
  SparseBVUnit _unit;
  BVIndex _startIndex;
  BVIndex _offset;
  BVSparseNode<Memory::JitArenaAllocator> *_curNode;
  BVIndex id;
  SymTable *symTable;
  SymToValueInfoMap symsRequiringCompensationToMergedValueInfoMap;
  Sym *symIV;
  bool isLoopPrePass;
  undefined1 auStack_198 [8];
  PathDependentInfoToRestore pathDependentInfoToRestore;
  PathDependentInfo *pathDependentInfo;
  BasicBlock *pred;
  FlowEdge **__edge;
  Iterator __iter;
  bool forceTypeSpecOnLoopHeader;
  undefined1 local_150 [8];
  BVSparse<Memory::JitArenaAllocator> symsCreatedForMerge;
  BVSparse<Memory::JitArenaAllocator> symsRequiringCompensation;
  GlobOptBlockData blockData;
  GlobOpt *globOpt_local;
  BasicBlock *this_local;
  
  if ((*(uint *)&globOpt->field_0xf4 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar13 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0x132f,"(!globOpt->isCallHelper)","!globOpt->isCallHelper");
    if (!bVar5) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar13 = 0;
  }
  GlobOptBlockData::GlobOptBlockData
            ((GlobOptBlockData *)&symsRequiringCompensation.lastUsedNodePrevNextField,
             (this->globOptData).curFunc);
  if ((*(uint *)&globOpt->field_0xf4 >> 5 & 1) == 0) {
    GlobOptBlockData::NullOutBlockData
              ((GlobOptBlockData *)&symsRequiringCompensation.lastUsedNodePrevNextField,globOpt,
               globOpt->func);
    BVSparse<Memory::JitArenaAllocator>::BVSparse
              ((BVSparse<Memory::JitArenaAllocator> *)&symsCreatedForMerge.lastUsedNodePrevNextField
               ,globOpt->tempAlloc);
    BVSparse<Memory::JitArenaAllocator>::BVSparse
              ((BVSparse<Memory::JitArenaAllocator> *)local_150,globOpt->tempAlloc);
    __iter.current._3_1_ = 1;
    pSVar14 = &GetPredList(this)->super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
    IVar28 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::GetIterator(pSVar14);
LAB_0053cf10:
    __iter.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)IVar28.current;
    __edge = (FlowEdge **)IVar28.list;
    if (__iter.list == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar13 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar5) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      IVar28.current = &(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>;
      IVar28.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)__edge;
      *puVar13 = 0;
    }
    __iter.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)IVar28.current;
    __edge = (FlowEdge **)IVar28.list;
    ppFVar4 = __edge;
    pSVar15 = SListNodeBase<Memory::ArenaAllocator>::Next
                        ((SListNodeBase<Memory::ArenaAllocator> *)__iter.list);
    bVar5 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::IsHead
                      ((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)ppFVar4,pSVar15);
    if (!bVar5) {
      __iter.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                    SListNodeBase<Memory::ArenaAllocator>::Next
                              (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
      ppFVar24 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                           ((Iterator *)&__edge);
      pBVar21 = FlowEdge::GetPred(*ppFVar24);
      if (pBVar21 == (BasicBlock *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                           ,0x1343,"(pred)","pred");
        if (!bVar5) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 0;
      }
      if (((pBVar21->globOptData).callSequence !=
           (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)0x0) &&
         (bVar5 = SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::Empty
                            ((pBVar21->globOptData).callSequence), bVar5)) {
        Memory::
        DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,SListBase<IR::Opnd*,Memory::ArenaAllocator,RealCount>>
                  (globOpt->alloc,(pBVar21->globOptData).callSequence);
        (pBVar21->globOptData).callSequence =
             (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
      }
      if ((((*(ushort *)&this->field_0x18 >> 2 & 1) != 0) &&
          (bVar5 = GlobOpt::IsLoopPrePass(globOpt), bVar5)) && (globOpt->prePassLoop == this->loop))
      goto code_r0x0053d1e2;
      goto LAB_0053d208;
    }
    __iter.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
    BVSparse<Memory::JitArenaAllocator>::~BVSparse((BVSparse<Memory::JitArenaAllocator> *)local_150)
    ;
    if (symsRequiringCompensation.lastUsedNodePrevNextField == (Type)0x0) {
      GlobOptBlockData::InitBlockData
                ((GlobOptBlockData *)&symsRequiringCompensation.lastUsedNodePrevNextField,globOpt,
                 globOpt->func);
    }
    bVar5 = GlobOpt::DoObjTypeSpec(globOpt);
    if (!bVar5) {
      GlobOpt::KillAllObjectTypes(globOpt,(this->globOptData).liveFields);
    }
    GlobOptBlockData::CopyBlockData
              (&this->globOptData,
               (GlobOptBlockData *)&symsRequiringCompensation.lastUsedNodePrevNextField);
    bVar5 = GlobOpt::IsLoopPrePass(globOpt);
    if (bVar5) {
      if (this->loop == (Loop *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                           ,0x1392,"(this->loop)","this->loop");
        if (!bVar5) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 0;
      }
      bVar5 = GlobOpt::DoBoundCheckHoist(globOpt);
      if (bVar5) {
        GlobOpt::SetInductionVariableValueNumbers
                  (globOpt,(GlobOptBlockData *)&symsRequiringCompensation.lastUsedNodePrevNextField)
        ;
      }
      if (((*(ushort *)&this->field_0x18 >> 2 & 1) != 0) && (globOpt->rootLoopPrePass == this->loop)
         ) {
        if (this->loop->bailOutInfo != (BailOutInfo *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar13 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                             ,0x139c,"(this->loop->bailOutInfo == nullptr)",
                             "this->loop->bailOutInfo == nullptr");
          if (!bVar5) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar13 = 0;
        }
        pBVar16 = CreateLoopTopBailOutInfo(this,globOpt);
        this->loop->bailOutInfo = pBVar16;
      }
    }
    else {
      CleanUpValueMaps(this);
      symsRequiringCompensationToMergedValueInfoMap.stats = (Type)0x0;
      JsUtil::
      BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::BaseDictionary((BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                        *)&symTable,globOpt->tempAlloc,0);
      bVar5 = BVSparse<Memory::JitArenaAllocator>::IsEmpty
                        ((BVSparse<Memory::JitArenaAllocator> *)
                         &symsCreatedForMerge.lastUsedNodePrevNextField);
      if (!bVar5) {
        pSVar1 = this->func->m_symTable;
        for (__startIndex = (BVSparseNode<Memory::JitArenaAllocator> *)
                            symsCreatedForMerge.lastUsedNodePrevNextField;
            __startIndex != (BVSparseNode<Memory::JitArenaAllocator> *)0x0;
            __startIndex = __startIndex->next) {
          _unit.word._0_4_ = __startIndex->startIndex;
          sym = *(Sym **)&__startIndex->data;
          _unit.word._4_4_ = BVUnitT<unsigned_long>::GetNextBit((BVUnitT<unsigned_long> *)&sym);
          while (_unit.word._4_4_ != 0xffffffff) {
            SVar8 = (int)_unit.word + _unit.word._4_4_;
            BVUnitT<unsigned_long>::Clear((BVUnitT<unsigned_long> *)&sym,_unit.word._4_4_);
            value = (Value *)SymTable::Find(pSVar1,SVar8);
            if ((Sym *)value == (Sym *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar13 = 1;
              bVar5 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                                 ,0x13b1,"(sym)","sym");
              if (!bVar5) {
                pcVar3 = (code *)invalidInstructionException();
                (*pcVar3)();
              }
              puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar13 = 0;
            }
            valueInfo = (ValueInfo *)
                        GlobOptBlockData::FindValue
                                  ((GlobOptBlockData *)
                                   &symsRequiringCompensation.lastUsedNodePrevNextField,(Sym *)value
                                  );
            if (valueInfo != (ValueInfo *)0x0) {
              tempBv = (BVSparse<Memory::JitArenaAllocator> *)
                       ::Value::GetValueInfo((Value *)valueInfo);
              bVar5 = ValueInfo::IsArrayValueInfo((ValueInfo *)tempBv);
              if (bVar5) {
                JsUtil::
                BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                ::Add((BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                       *)&symTable,(Sym **)&value,(ValueInfo **)&tempBv);
              }
            }
            _unit.word._4_4_ = BVUnitT<unsigned_long>::GetNextBit((BVUnitT<unsigned_long> *)&sym);
          }
          if (__startIndex == (BVSparseNode<Memory::JitArenaAllocator> *)0x0) break;
        }
        BVSparse<Memory::JitArenaAllocator>::ClearAll
                  ((BVSparse<Memory::JitArenaAllocator> *)
                   &symsCreatedForMerge.lastUsedNodePrevNextField);
      }
      if ((*(ushort *)&this->field_0x18 >> 2 & 1) != 0) {
        pBVar26 = globOpt->tempBv;
        bVar5 = BVSparse<Memory::JitArenaAllocator>::IsEmpty(pBVar26);
        if (!bVar5) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar13 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                             ,0x13d0,"(tempBv->IsEmpty())","tempBv->IsEmpty()");
          if (!bVar5) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar13 = 0;
        }
        pLVar2 = this->loop;
        pSVar1 = this->func->m_symTable;
        pJVar25 = globOpt->alloc;
        BVSparse<Memory::JitArenaAllocator>::Or
                  (pBVar26,pLVar2->likelyIntSymsUsedBeforeDefined,pLVar2->symsDefInLoop);
        BVSparse<Memory::JitArenaAllocator>::And(pBVar26,blockData.liveVarSyms);
        BVSparse<Memory::JitArenaAllocator>::Minus(pBVar26,blockData.liveInt32Syms);
        for (__startIndex_1 = pBVar26->head; __startIndex_1 != (Type_conflict)0x0;
            __startIndex_1 = __startIndex_1->next) {
          _unit_1.word._0_4_ = __startIndex_1->startIndex;
          varSym = (StackSym *)(__startIndex_1->data).word;
          _unit_1.word._4_4_ = BVUnitT<unsigned_long>::GetNextBit((BVUnitT<unsigned_long> *)&varSym)
          ;
          while (_unit_1.word._4_4_ != 0xffffffff) {
            SVar8 = (Type)_unit_1.word + _unit_1.word._4_4_;
            BVUnitT<unsigned_long>::Clear((BVUnitT<unsigned_long> *)&varSym,_unit_1.word._4_4_);
            pSVar17 = SymTable::FindStackSym(pSVar1,SVar8);
            if (pSVar17 == (StackSym *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar13 = 1;
              bVar5 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                                 ,0x13dc,"(varSym)","varSym");
              if (!bVar5) {
                pcVar3 = (code *)invalidInstructionException();
                (*pcVar3)();
              }
              puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar13 = 0;
            }
            pVVar18 = GlobOptBlockData::FindValue
                                ((GlobOptBlockData *)
                                 &symsRequiringCompensation.lastUsedNodePrevNextField,
                                 &pSVar17->super_Sym);
            if (pVVar18 == (Value *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar13 = 1;
              bVar5 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                                 ,0x13de,"(value)","value");
              if (!bVar5) {
                pcVar3 = (code *)invalidInstructionException();
                (*pcVar3)();
              }
              puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar13 = 0;
            }
            pVVar19 = ::Value::GetValueInfo(pVVar18);
            bVar5 = ValueType::IsInt(&pVVar19->super_ValueType);
            if (!bVar5) {
              pVVar19 = ValueInfo::SpecializeToInt32(pVVar19,pJVar25,false);
              GlobOpt::ChangeValueInfo(globOpt,(BasicBlock *)0x0,pVVar18,pVVar19,false,false);
            }
            _unit_1.word._4_4_ =
                 BVUnitT<unsigned_long>::GetNextBit((BVUnitT<unsigned_long> *)&varSym);
          }
          if (__startIndex_1 == (Type_conflict)0x0) break;
        }
        BVSparse<Memory::JitArenaAllocator>::Or
                  (pBVar26,pLVar2->likelyNumberSymsUsedBeforeDefined,pLVar2->symsDefInLoop);
        BVSparse<Memory::JitArenaAllocator>::Or(pBVar26,pLVar2->forceFloat64SymsOnEntry);
        BVSparse<Memory::JitArenaAllocator>::And(pBVar26,blockData.liveLossyInt32Syms);
        pBVar21 = pLVar2->landingPad;
        for (__startIndex_2 = pBVar26->head; __startIndex_2 != (Type_conflict)0x0;
            __startIndex_2 = __startIndex_2->next) {
          _unit_2.word._0_4_ = __startIndex_2->startIndex;
          varSym_1 = (StackSym *)(__startIndex_2->data).word;
          _unit_2.word._4_4_ =
               BVUnitT<unsigned_long>::GetNextBit((BVUnitT<unsigned_long> *)&varSym_1);
          while (_unit_2.word._4_4_ != 0xffffffff) {
            SVar8 = (Type)_unit_2.word + _unit_2.word._4_4_;
            BVUnitT<unsigned_long>::Clear((BVUnitT<unsigned_long> *)&varSym_1,_unit_2.word._4_4_);
            pSVar17 = SymTable::FindStackSym(pSVar1,SVar8);
            if (pSVar17 == (StackSym *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar13 = 1;
              bVar5 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                                 ,0x13ee,"(varSym)","varSym");
              if (!bVar5) {
                pcVar3 = (code *)invalidInstructionException();
                (*pcVar3)();
              }
              puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar13 = 0;
            }
            pSVar20 = StackSym::GetFloat64EquivSym(pSVar17,(Func *)0x0);
            if (((pSVar20 == (StackSym *)0x0) || ((*(uint *)&pSVar20->field_0x18 >> 0x11 & 1) != 0))
               || (bVar5 = GlobOptBlockData::IsFloat64TypeSpecialized
                                     (&pBVar21->globOptData,&pSVar17->super_Sym), !bVar5)) {
              pVVar18 = GlobOptBlockData::FindValue
                                  ((GlobOptBlockData *)
                                   &symsRequiringCompensation.lastUsedNodePrevNextField,
                                   &pSVar17->super_Sym);
              if (pVVar18 == (Value *)0x0) {
                pVVar18 = GlobOpt::NewGenericValue(globOpt,ValueType::Float);
                GlobOptBlockData::SetValue(&this->globOptData,pVVar18,&pSVar17->super_Sym);
              }
              else {
                pVVar19 = ::Value::GetValueInfo(pVVar18);
                bVar5 = ValueType::IsNumber(&pVVar19->super_ValueType);
                if (!bVar5) {
                  pVVar19 = ValueInfo::SpecializeToFloat64(pVVar19,pJVar25);
                  GlobOpt::ChangeValueInfo(globOpt,this,pVVar18,pVVar19,false,false);
                }
              }
            }
            _unit_2.word._4_4_ =
                 BVUnitT<unsigned_long>::GetNextBit((BVUnitT<unsigned_long> *)&varSym_1);
          }
          if (__startIndex_2 == (Type_conflict)0x0) break;
        }
        BVSparse<Memory::JitArenaAllocator>::ClearAll(pBVar26);
      }
      bVar5 = BVSparse<Memory::JitArenaAllocator>::IsEmpty(globOpt->tempBv);
      if (!bVar5) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                           ,0x1413,"(globOpt->tempBv->IsEmpty())","globOpt->tempBv->IsEmpty()");
        if (!bVar5) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 0;
      }
      BVSparse<Memory::JitArenaAllocator>::BVSparse
                ((BVSparse<Memory::JitArenaAllocator> *)
                 &symsNeedingLosslessIntConversion.lastUsedNodePrevNextField,globOpt->tempAlloc);
      BVSparse<Memory::JitArenaAllocator>::BVSparse
                ((BVSparse<Memory::JitArenaAllocator> *)
                 &symsNeedingFloatConversion.lastUsedNodePrevNextField,globOpt->tempAlloc);
      BVSparse<Memory::JitArenaAllocator>::BVSparse
                ((BVSparse<Memory::JitArenaAllocator> *)&iter.last,globOpt->tempAlloc);
      pSVar14 = &GetPredList(this)->super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
      SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::GetEditingIterator
                ((EditingIterator *)&edge,pSVar14);
      while (bVar5 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::Next
                               ((EditingIterator *)&edge), bVar5) {
        ppFVar24 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                             ((Iterator *)&edge);
        pBVar21 = FlowEdge::GetPred(*ppFVar24);
        if ((pBVar21->loop == (Loop *)0x0) ||
           (pBVar22 = Loop::GetHeadBlock(pBVar21->loop), pBVar22 != this)) {
          pBStack_388 = (BasicBlock *)0x0;
          orgPred = pBVar21;
          if ((*(ushort *)&pBVar21->field_0x18 >> 6 & 1) != 0) {
            pSVar14 = &GetPredList(pBVar21)->
                       super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
            bVar5 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::HasOne(pSVar14);
            if (!bVar5) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar13 = 1;
              bVar5 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                                 ,0x1427,"(pred->GetPredList()->HasOne())",
                                 "pred->GetPredList()->HasOne()");
              if (!bVar5) {
                pcVar3 = (code *)invalidInstructionException();
                (*pcVar3)();
              }
              puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar13 = 0;
            }
            pSVar14 = &GetPredList(pBVar21)->
                       super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
            ppFVar23 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Head(pSVar14);
            orgPred = FlowEdge::GetPred(*ppFVar23);
            pBStack_388 = pBVar21;
          }
          BVSparse<Memory::JitArenaAllocator>::Minus
                    ((BVSparse<Memory::JitArenaAllocator> *)
                     &symsNeedingLosslessIntConversion.lastUsedNodePrevNextField,
                     blockData.liveInt32Syms,(orgPred->globOptData).liveInt32Syms);
          BVSparse<Memory::JitArenaAllocator>::Minus
                    ((BVSparse<Memory::JitArenaAllocator> *)
                     &symsNeedingFloatConversion.lastUsedNodePrevNextField,blockData.liveVarSyms,
                     blockData.liveInt32Syms);
          BVSparse<Memory::JitArenaAllocator>::Minus
                    (globOpt->tempBv,(orgPred->globOptData).liveInt32Syms,
                     (orgPred->globOptData).liveLossyInt32Syms);
          BVSparse<Memory::JitArenaAllocator>::Minus
                    ((BVSparse<Memory::JitArenaAllocator> *)
                     &symsNeedingFloatConversion.lastUsedNodePrevNextField,globOpt->tempBv);
          BVSparse<Memory::JitArenaAllocator>::Minus
                    (globOpt->tempBv,blockData.isTempSrc,(orgPred->globOptData).liveVarSyms);
          BVSparse<Memory::JitArenaAllocator>::Minus
                    ((BVSparse<Memory::JitArenaAllocator> *)&iter.last,blockData.liveLossyInt32Syms,
                     (orgPred->globOptData).liveFloat64Syms);
          bVar5 = false;
          if (symsRequiringCompensationToMergedValueInfoMap.stats != (Type)0x0) {
            BVar6 = BVSparse<Memory::JitArenaAllocator>::Test
                              ((orgPred->globOptData).liveInt32Syms,
                               (symsRequiringCompensationToMergedValueInfoMap.stats)->
                               countOfEmptyBuckets);
            bVar5 = false;
            if (BVar6 == '\0') {
              BVar6 = BVSparse<Memory::JitArenaAllocator>::Test
                                ((BVSparse<Memory::JitArenaAllocator> *)
                                 &symsNeedingFloatConversion.lastUsedNodePrevNextField,
                                 (symsRequiringCompensationToMergedValueInfoMap.stats)->
                                 countOfEmptyBuckets);
              bVar5 = BVar6 == '\0';
            }
          }
          bVar7 = BVSparse<Memory::JitArenaAllocator>::IsEmpty(globOpt->tempBv);
          if (((!bVar7) ||
              (bVar7 = BVSparse<Memory::JitArenaAllocator>::IsEmpty
                                 ((BVSparse<Memory::JitArenaAllocator> *)
                                  &symsNeedingLosslessIntConversion.lastUsedNodePrevNextField),
              !bVar7)) ||
             ((bVar7 = BVSparse<Memory::JitArenaAllocator>::IsEmpty
                                 ((BVSparse<Memory::JitArenaAllocator> *)
                                  &symsNeedingFloatConversion.lastUsedNodePrevNextField), !bVar7 ||
              (((bVar7 = BVSparse<Memory::JitArenaAllocator>::IsEmpty
                                   ((BVSparse<Memory::JitArenaAllocator> *)&iter.last), !bVar7 ||
                (bVar5)) ||
               (iVar11 = JsUtil::
                         BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                         ::Count((BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                                  *)&symTable), iVar11 != 0)))))) {
            pSVar14 = &GetSuccList(orgPred)->
                       super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
            ppFVar23 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Head(pSVar14);
            pBVar21 = FlowEdge::GetSucc(*ppFVar23);
            if (pBVar21 == this) {
              if ((orgPred->loop != (Loop *)0x0) && (orgPred->loop->parent == this->loop)) {
                pSVar27 = GetSuccList(orgPred);
                uVar12 = RealCount::Count(&(pSVar27->
                                           super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>
                                           ).super_RealCount);
                if (1 < uVar12) goto LAB_0053e842;
              }
            }
            else {
LAB_0053e842:
              __iter_1.current = (NodeBase *)0x0;
              if (pBStack_388 == (BasicBlock *)0x0) {
                uVar12 = Func::GetSourceContextId(this->func);
                functionId = Func::GetLocalFunctionId(this->func);
                bVar7 = Js::Phases::IsEnabled
                                  ((Phases *)&DAT_01ec1678,GlobOptPhase,uVar12,functionId);
                if ((bVar7) && (bVar7 = GlobOpt::IsLoopPrePass(globOpt), !bVar7)) {
                  Output::Print(L"TRACE: ");
                  uVar9 = GetBlockNum(orgPred);
                  uVar10 = GetBlockNum(this);
                  Output::Print(L"Inserting airlock block to convert syms to var between block %d and %d\n"
                                ,(ulong)uVar9,(ulong)uVar10);
                  Output::Flush();
                }
                __iter_1.current =
                     (NodeBase *)FlowGraph::InsertAirlockBlock(globOpt->func->m_fg,*ppFVar24,false);
              }
              else {
                if ((*(ushort *)&pBStack_388->field_0x18 >> 6 & 1) == 0) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar13 = 1;
                  bVar7 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                                     ,0x145a,"(orgPred->isAirLockCompensationBlock)",
                                     "orgPred->isAirLockCompensationBlock");
                  if (!bVar7) {
                    pcVar3 = (code *)invalidInstructionException();
                    (*pcVar3)();
                  }
                  puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar13 = 0;
                }
                __iter_1.current = (NodeBase *)pBStack_388;
                DecrementDataUseCount(orgPred);
                *(ushort *)&__iter_1.current[3].next = *(ushort *)&__iter_1.current[3].next & 0xffbf
                ;
              }
              GlobOpt::CloneBlockData(globOpt,(BasicBlock *)__iter_1.current,orgPred);
              orgPred = (BasicBlock *)__iter_1.current;
            }
            bVar7 = BVSparse<Memory::JitArenaAllocator>::IsEmpty(globOpt->tempBv);
            if (!bVar7) {
              GlobOpt::ToVar(globOpt,globOpt->tempBv,orgPred,(Instr *)0x0);
            }
            bVar7 = BVSparse<Memory::JitArenaAllocator>::IsEmpty
                              ((BVSparse<Memory::JitArenaAllocator> *)
                               &symsNeedingLosslessIntConversion.lastUsedNodePrevNextField);
            if (!bVar7) {
              GlobOpt::ToInt32(globOpt,(BVSparse<Memory::JitArenaAllocator> *)
                                       &symsNeedingLosslessIntConversion.lastUsedNodePrevNextField,
                               orgPred,true,(Instr *)0x0);
            }
            bVar7 = BVSparse<Memory::JitArenaAllocator>::IsEmpty
                              ((BVSparse<Memory::JitArenaAllocator> *)
                               &symsNeedingFloatConversion.lastUsedNodePrevNextField);
            if (!bVar7) {
              GlobOpt::ToInt32(globOpt,(BVSparse<Memory::JitArenaAllocator> *)
                                       &symsNeedingFloatConversion.lastUsedNodePrevNextField,orgPred
                               ,false,(Instr *)0x0);
            }
            bVar7 = BVSparse<Memory::JitArenaAllocator>::IsEmpty
                              ((BVSparse<Memory::JitArenaAllocator> *)&iter.last);
            if (!bVar7) {
              GlobOpt::ToFloat64(globOpt,(BVSparse<Memory::JitArenaAllocator> *)&iter.last,orgPred);
            }
            if (bVar5) {
              BVSparse<Memory::JitArenaAllocator>::ClearAll(globOpt->tempBv);
              BVSparse<Memory::JitArenaAllocator>::Set
                        (globOpt->tempBv,
                         (symsRequiringCompensationToMergedValueInfoMap.stats)->countOfEmptyBuckets)
              ;
              GlobOpt::ToInt32(globOpt,globOpt->tempBv,orgPred,false,(Instr *)0x0);
            }
            iVar11 = JsUtil::
                     BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                     ::Count((BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                              *)&symTable);
            if (iVar11 != 0) {
              GlobOpt::InsertValueCompensation(globOpt,orgPred,this,(SymToValueInfoMap *)&symTable);
            }
          }
        }
        else {
          DecrementDataUseCount(pBVar21);
        }
      }
      pSVar14 = &GetPredList(this)->super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
      IVar30 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::GetIterator(pSVar14);
      while( true ) {
        __iter_1.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)IVar30.current;
        edge_1 = (FlowEdge **)IVar30.list;
        if (__iter_1.list == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar13 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar5) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          IVar30.current = &(__iter_1.list)->super_SListNodeBase<Memory::ArenaAllocator>;
          IVar30.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)edge_1;
          *puVar13 = 0;
        }
        __iter_1.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)IVar30.current;
        edge_1 = (FlowEdge **)IVar30.list;
        ppFVar4 = edge_1;
        pSVar15 = SListNodeBase<Memory::ArenaAllocator>::Next
                            ((SListNodeBase<Memory::ArenaAllocator> *)__iter_1.list);
        bVar5 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::IsHead
                          ((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)ppFVar4,
                           pSVar15);
        if (bVar5) break;
        __iter_1.list =
             (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
             SListNodeBase<Memory::ArenaAllocator>::Next
                       (&(__iter_1.list)->super_SListNodeBase<Memory::ArenaAllocator>);
        pred_2 = (BasicBlock *)
                 SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                           ((Iterator *)&edge_1);
        loop_1 = (Loop *)FlowEdge::GetPred((FlowEdge *)pred_2->next);
        if (((*(ushort *)&this->field_0x18 >> 2 & 1) == 0) ||
           (this->loop != ((BasicBlock *)loop_1)->loop)) {
          if ((*(ushort *)&((BasicBlock *)loop_1)->field_0x18 >> 6 & 1) != 0) {
            DecrementDataUseCount((BasicBlock *)loop_1);
            pSVar14 = &GetPredList((BasicBlock *)loop_1)->
                       super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
            bVar5 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::HasOne(pSVar14);
            if (!bVar5) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar13 = 1;
              bVar5 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                                 ,0x148c,"(pred->GetPredList()->HasOne())",
                                 "pred->GetPredList()->HasOne()");
              if (!bVar5) {
                pcVar3 = (code *)invalidInstructionException();
                (*pcVar3)();
              }
              puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar13 = 0;
            }
            pSVar14 = &GetPredList((BasicBlock *)loop_1)->
                       super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
            ppFVar24 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Head(pSVar14);
            loop_1 = (Loop *)FlowEdge::GetPred(*ppFVar24);
          }
          uVar12 = DecrementDataUseCount((BasicBlock *)loop_1);
          if ((uVar12 == 0) &&
             ((this->loop == (Loop *)0x0 || (this->loop->landingPad != (BasicBlock *)loop_1)))) {
            pSVar14 = &GetSuccList((BasicBlock *)loop_1)->
                       super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
            bVar5 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::HasOne(pSVar14);
            if (bVar5) {
              pSVar14 = &GetPredList(this)->
                         super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
              bVar5 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::HasOne(pSVar14);
              if ((bVar5) && (this->loop == (Loop *)0x0)) {
                GlobOptBlockData::NullOutBlockData
                          ((GlobOptBlockData *)&loop_1->endDisableImplicitCall,globOpt,globOpt->func
                          );
                goto LAB_0053f005;
              }
            }
            GlobOptBlockData::DeleteBlockData((GlobOptBlockData *)&loop_1->endDisableImplicitCall);
          }
        }
LAB_0053f005:
        IVar30.current = &(__iter_1.list)->super_SListNodeBase<Memory::ArenaAllocator>;
        IVar30.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)edge_1;
      }
      __iter_1.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
      BVSparse<Memory::JitArenaAllocator>::ClearAll(globOpt->tempBv);
      bVar5 = GlobOpt::IsLoopPrePass(globOpt);
      if (bVar5) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                           ,0x149f,"(!globOpt->IsLoopPrePass())","!globOpt->IsLoopPrePass()");
        if (!bVar5) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar13 = 0;
      }
      if ((*(ushort *)&this->field_0x18 >> 2 & 1) == 0) {
        if (this->loop == (Loop *)0x0) {
          pSVar27 = GetSuccList(this);
          uVar12 = RealCount::Count(&(pSVar27->
                                     super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>)
                                     .super_RealCount);
          SetDataUseCount(this,uVar12);
        }
        else if (this == this->loop->dominatingLoopCountableBlock) {
          GlobOpt::DetermineLoopCount(globOpt,this->loop);
        }
      }
      else {
        local_3c0 = this->loop;
        pJVar25 = globOpt->alloc;
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_3e8,(type_info *)&BVSparse<Memory::JitArenaAllocator>::typeinfo,0,
                   0xffffffffffffffff,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                   ,0x14a7);
        pJVar25 = (JitArenaAllocator *)
                  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                  TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                  *)pJVar25,&local_3e8);
        local_3f8 = Memory::JitArenaAllocator::Alloc;
        local_3f0 = 0;
        pBVar26 = (BVSparse<Memory::JitArenaAllocator> *)
                  new<Memory::JitArenaAllocator>(0x20,pJVar25,0x4e98c0);
        BVSparse<Memory::JitArenaAllocator>::BVSparse(pBVar26,globOpt->alloc);
        local_3c0->varSymsOnEntry = pBVar26;
        BVSparse<Memory::JitArenaAllocator>::Copy<Memory::JitArenaAllocator>
                  (local_3c0->varSymsOnEntry,(this->globOptData).liveVarSyms);
        pJVar25 = globOpt->alloc;
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_420,(type_info *)&BVSparse<Memory::JitArenaAllocator>::typeinfo,0,
                   0xffffffffffffffff,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                   ,0x14aa);
        pJVar25 = (JitArenaAllocator *)
                  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                  TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                  *)pJVar25,&local_420);
        local_430 = Memory::JitArenaAllocator::Alloc;
        local_428 = 0;
        pBVar26 = (BVSparse<Memory::JitArenaAllocator> *)
                  new<Memory::JitArenaAllocator>(0x20,pJVar25,0x4e98c0);
        BVSparse<Memory::JitArenaAllocator>::BVSparse(pBVar26,globOpt->alloc);
        local_3c0->int32SymsOnEntry = pBVar26;
        BVSparse<Memory::JitArenaAllocator>::Copy<Memory::JitArenaAllocator>
                  (local_3c0->int32SymsOnEntry,(this->globOptData).liveInt32Syms);
        pJVar25 = globOpt->alloc;
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_458,(type_info *)&BVSparse<Memory::JitArenaAllocator>::typeinfo,0,
                   0xffffffffffffffff,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                   ,0x14ad);
        pJVar25 = (JitArenaAllocator *)
                  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                  TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                  *)pJVar25,&local_458);
        local_468 = Memory::JitArenaAllocator::Alloc;
        local_460 = 0;
        pBVar26 = (BVSparse<Memory::JitArenaAllocator> *)
                  new<Memory::JitArenaAllocator>(0x20,pJVar25,0x4e98c0);
        BVSparse<Memory::JitArenaAllocator>::BVSparse(pBVar26,globOpt->alloc);
        local_3c0->lossyInt32SymsOnEntry = pBVar26;
        BVSparse<Memory::JitArenaAllocator>::Copy<Memory::JitArenaAllocator>
                  (local_3c0->lossyInt32SymsOnEntry,(this->globOptData).liveLossyInt32Syms);
        pJVar25 = globOpt->alloc;
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_490,(type_info *)&BVSparse<Memory::JitArenaAllocator>::typeinfo,0,
                   0xffffffffffffffff,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                   ,0x14b0);
        pJVar25 = (JitArenaAllocator *)
                  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                  TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                  *)pJVar25,&local_490);
        local_4a0 = Memory::JitArenaAllocator::Alloc;
        local_498 = 0;
        pBVar26 = (BVSparse<Memory::JitArenaAllocator> *)
                  new<Memory::JitArenaAllocator>(0x20,pJVar25,0x4e98c0);
        BVSparse<Memory::JitArenaAllocator>::BVSparse(pBVar26,globOpt->alloc);
        local_3c0->float64SymsOnEntry = pBVar26;
        BVSparse<Memory::JitArenaAllocator>::Copy<Memory::JitArenaAllocator>
                  (local_3c0->float64SymsOnEntry,(this->globOptData).liveFloat64Syms);
        pJVar25 = globOpt->alloc;
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_4c8,(type_info *)&BVSparse<Memory::JitArenaAllocator>::typeinfo,0,
                   0xffffffffffffffff,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                   ,0x14b3);
        pJVar25 = (JitArenaAllocator *)
                  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                  TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                  *)pJVar25,&local_4c8);
        local_4d8 = Memory::JitArenaAllocator::Alloc;
        local_4d0 = 0;
        pBVar26 = (BVSparse<Memory::JitArenaAllocator> *)
                  new<Memory::JitArenaAllocator>(0x20,pJVar25,0x4e98c0);
        BVSparse<Memory::JitArenaAllocator>::BVSparse(pBVar26,globOpt->alloc);
        local_3c0->liveFieldsOnEntry = pBVar26;
        BVSparse<Memory::JitArenaAllocator>::Copy<Memory::JitArenaAllocator>
                  (local_3c0->liveFieldsOnEntry,(this->globOptData).liveFields);
        iVar11 = JsUtil::
                 BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 ::Count((BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                          *)&symTable);
        if (iVar11 != 0) {
          pJVar25 = globOpt->alloc;
          Memory::TrackAllocData::CreateTrackAllocData
                    (&local_500,
                     (type_info *)
                     &JsUtil::
                      BaseDictionary<Sym*,ValueInfo*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      ::typeinfo,0,0xffffffffffffffff,
                     "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                     ,0x14b8);
          pJVar25 = (JitArenaAllocator *)
                    Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                    TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                    *)pJVar25,&local_500);
          this_00 = (BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                     *)new<Memory::JitArenaAllocator>(0x38,pJVar25,0x4e98c0);
          JsUtil::
          BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::BaseDictionary(this_00,globOpt->alloc,0);
          local_3c0->symsRequiringCompensationToMergedValueInfoMap = this_00;
          JsUtil::
          BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::Copy(local_3c0->symsRequiringCompensationToMergedValueInfoMap,
                 (BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  *)&symTable);
        }
        bVar5 = GlobOpt::DoBoundCheckHoist(globOpt);
        if ((bVar5) && (local_3c0->inductionVariables != (InductionVariableSet *)0x0)) {
          GlobOpt::FinalizeInductionVariables
                    (globOpt,local_3c0,
                     (GlobOptBlockData *)&symsRequiringCompensation.lastUsedNodePrevNextField);
          bVar5 = GlobOpt::DoLoopCountBasedBoundCheckHoist(globOpt);
          if (bVar5) {
            GlobOpt::DetermineDominatingLoopCountableBlock(globOpt,local_3c0,this);
          }
        }
      }
      BVSparse<Memory::JitArenaAllocator>::~BVSparse
                ((BVSparse<Memory::JitArenaAllocator> *)&iter.last);
      BVSparse<Memory::JitArenaAllocator>::~BVSparse
                ((BVSparse<Memory::JitArenaAllocator> *)
                 &symsNeedingFloatConversion.lastUsedNodePrevNextField);
      BVSparse<Memory::JitArenaAllocator>::~BVSparse
                ((BVSparse<Memory::JitArenaAllocator> *)
                 &symsNeedingLosslessIntConversion.lastUsedNodePrevNextField);
      JsUtil::
      BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::~BaseDictionary((BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                         *)&symTable);
    }
    BVSparse<Memory::JitArenaAllocator>::~BVSparse
              ((BVSparse<Memory::JitArenaAllocator> *)&symsCreatedForMerge.lastUsedNodePrevNextField
              );
  }
  else {
    GlobOptBlockData::CopyBlockData
              ((GlobOptBlockData *)&symsRequiringCompensation.lastUsedNodePrevNextField,
               &this->globOptData);
  }
  return;
code_r0x0053d1e2:
  bVar5 = Loop::IsDescendentOrSelf(this->loop,pBVar21->loop);
  IVar28.current = &(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>;
  IVar28.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)__edge;
  if (bVar5) goto LAB_0053cf10;
LAB_0053d208:
  pathDependentInfoToRestore.rightValueInfo = (ValueInfo *)FlowEdge::GetPathDependentInfo(*ppFVar24)
  ;
  PathDependentInfoToRestore::PathDependentInfoToRestore((PathDependentInfoToRestore *)auStack_198);
  PVar29.rightValueInfo = pathDependentInfoToRestore.leftValueInfo;
  PVar29.leftValueInfo = (ValueInfo *)auStack_198;
  if (pathDependentInfoToRestore.rightValueInfo != (ValueInfo *)0x0) {
    PVar29 = GlobOpt::UpdatePathDependentInfo
                       (globOpt,(PathDependentInfo *)pathDependentInfoToRestore.rightValueInfo);
  }
  pathDependentInfoToRestore.leftValueInfo = PVar29.rightValueInfo;
  auStack_198 = (undefined1  [8])PVar29.leftValueInfo;
  uVar12 = GetDataUseCount(pBVar21);
  if (uVar12 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar13 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0x1359,"(pred->GetDataUseCount())","pred->GetDataUseCount()");
    if (!bVar5) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar13 = 0;
  }
  if (symsRequiringCompensation.lastUsedNodePrevNextField == (Type)0x0) {
    pSVar14 = &GetSuccList(pBVar21)->super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
    bVar5 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::HasOne(pSVar14);
    if (bVar5) {
      pSVar14 = &GetPredList(this)->super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
      bVar5 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::HasOne(pSVar14);
      if ((bVar5) && (this->loop == (Loop *)0x0)) {
        GlobOptBlockData::ReuseBlockData
                  ((GlobOptBlockData *)&symsRequiringCompensation.lastUsedNodePrevNextField,
                   &pBVar21->globOptData);
        PathDependentInfoToRestore::Clear((PathDependentInfoToRestore *)auStack_198);
        goto LAB_0053d4cd;
      }
    }
    GlobOptBlockData::CloneBlockData
              ((GlobOptBlockData *)&symsRequiringCompensation.lastUsedNodePrevNextField,this,pBVar21
              );
  }
  else {
    bVar5 = GlobOpt::IsLoopPrePass(globOpt);
    if (bVar5) {
      local_5b8 = (BVSparse<Memory::JitArenaAllocator> *)0x0;
      local_5c8 = (BVSparse<Memory::JitArenaAllocator> *)0x0;
    }
    else {
      local_5b8 = (BVSparse<Memory::JitArenaAllocator> *)
                  &symsCreatedForMerge.lastUsedNodePrevNextField;
      local_5c8 = (BVSparse<Memory::JitArenaAllocator> *)local_150;
    }
    GlobOptBlockData::MergeBlockData
              ((GlobOptBlockData *)&symsRequiringCompensation.lastUsedNodePrevNextField,this,pBVar21
               ,local_5b8,local_5c8,(bool)(__iter.current._3_1_ & 1));
    __iter.current._3_1_ = 0;
  }
LAB_0053d4cd:
  if (pathDependentInfoToRestore.rightValueInfo != (ValueInfo *)0x0) {
    infoToRestore.rightValueInfo = pathDependentInfoToRestore.leftValueInfo;
    infoToRestore.leftValueInfo = (ValueInfo *)auStack_198;
    GlobOpt::RestorePathDependentInfo
              (globOpt,(PathDependentInfo *)pathDependentInfoToRestore.rightValueInfo,infoToRestore)
    ;
    FlowEdge::ClearPathDependentInfo(*ppFVar24,globOpt->alloc);
  }
  IVar28.current = &(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>;
  IVar28.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)__edge;
  goto LAB_0053cf10;
}

Assistant:

void
BasicBlock::MergePredBlocksValueMaps(GlobOpt* globOpt)
{
    Assert(!globOpt->isCallHelper);
    // We keep a local temporary copy for the merge
    GlobOptBlockData blockData(this->globOptData.curFunc);

    if (!globOpt->isRecursiveCallOnLandingPad)
    {
        blockData.NullOutBlockData(globOpt, globOpt->func);
    }
    else
    {
        // If we are going over the landing pad again after field PRE, just start again
        // with the value table where we left off.
        blockData.CopyBlockData(&this->globOptData);
        return;
    }

    BVSparse<JitArenaAllocator> symsRequiringCompensation(globOpt->tempAlloc);
    {
        BVSparse<JitArenaAllocator> symsCreatedForMerge(globOpt->tempAlloc);
        bool forceTypeSpecOnLoopHeader = true;
        FOREACH_PREDECESSOR_BLOCK(pred, this)
        {
            if (pred->globOptData.callSequence && pred->globOptData.callSequence->Empty())
            {
                JitAdelete(globOpt->alloc, pred->globOptData.callSequence);
                pred->globOptData.callSequence = nullptr;
            }
            if (this->isLoopHeader && globOpt->IsLoopPrePass() && globOpt->prePassLoop == this->loop && this->loop->IsDescendentOrSelf(pred->loop))
            {
                // Loop back-edge.
                // First pass on loop runs optimistically, without doing transforms.
                // Skip this edge for now.
                continue;
            }

            PathDependentInfo *const pathDependentInfo = __edge->GetPathDependentInfo();
            PathDependentInfoToRestore pathDependentInfoToRestore;
            if (pathDependentInfo)
            {
                pathDependentInfoToRestore = globOpt->UpdatePathDependentInfo(pathDependentInfo);
            }

            Assert(pred->GetDataUseCount());

            // First pred?
            if (blockData.symToValueMap == nullptr)
            {
                // Only one edge?
                if (pred->GetSuccList()->HasOne() && this->GetPredList()->HasOne() && this->loop == nullptr)
                {
                    blockData.ReuseBlockData(&pred->globOptData);

                    // Don't need to restore the old value info
                    pathDependentInfoToRestore.Clear();
                }
                else
                {
                    blockData.CloneBlockData(this, pred);
                }
            }
            else
            {
                const bool isLoopPrePass = globOpt->IsLoopPrePass();
                blockData.MergeBlockData(
                    this,
                    pred,
                    isLoopPrePass ? nullptr : &symsRequiringCompensation,
                    isLoopPrePass ? nullptr : &symsCreatedForMerge,
                    forceTypeSpecOnLoopHeader);
                forceTypeSpecOnLoopHeader = false; // can force type-spec on the loop header only for the first back edge.
            }

            // Restore the value for the next edge
            if (pathDependentInfo)
            {
                globOpt->RestorePathDependentInfo(pathDependentInfo, pathDependentInfoToRestore);
                __edge->ClearPathDependentInfo(globOpt->alloc);
            }

        } NEXT_PREDECESSOR_BLOCK;
    }

    // Consider: We can recreate values for hoisted field so it can copy prop out of the loop
    if (blockData.symToValueMap == nullptr)
    {
        blockData.InitBlockData(globOpt, globOpt->func);
    }

    if (!globOpt->DoObjTypeSpec())
    {
        // Object type specialization is off, but if copy prop is on (e.g., /force:fieldhoist) we're not clearing liveFields,
        // so we may be letting type syms slip through this block.
        globOpt->KillAllObjectTypes(this->globOptData.liveFields);
    }

    this->globOptData.CopyBlockData(&blockData);

    if (globOpt->IsLoopPrePass())
    {
        Assert(this->loop);

        if(globOpt->DoBoundCheckHoist())
        {
            globOpt->SetInductionVariableValueNumbers(&blockData);
        }

        if (this->isLoopHeader && globOpt->rootLoopPrePass == this->loop)
        {
            // Capture bail out info in case we have optimization that needs it
            Assert(this->loop->bailOutInfo == nullptr);
            this->loop->bailOutInfo = this->CreateLoopTopBailOutInfo(globOpt);
        }

        // If loop pre-pass, don't insert convert from type-spec to var
        return;
    }

    this->CleanUpValueMaps();
    Sym *symIV = nullptr;

    // Clean up the syms requiring compensation by checking the final value in the merged block to see if the sym still requires
    // compensation. All the while, create a mapping from sym to value info in the merged block. This dictionary helps avoid a
    // value lookup in the merged block per predecessor.
    SymToValueInfoMap symsRequiringCompensationToMergedValueInfoMap(globOpt->tempAlloc);
    if(!symsRequiringCompensation.IsEmpty())
    {
        const SymTable *const symTable = func->m_symTable;
        FOREACH_BITSET_IN_SPARSEBV(id, &symsRequiringCompensation)
        {
            Sym *const sym = symTable->Find(id);
            Assert(sym);

            Value *const value = blockData.FindValue(sym);
            if(!value)
            {
                continue;
            }

            ValueInfo *const valueInfo = value->GetValueInfo();
            if(!valueInfo->IsArrayValueInfo())
            {
                continue;
            }

            // At least one new sym was created while merging and associated with the merged value info, so those syms will
            // require compensation in predecessors. For now, the dead store phase is relied upon to remove compensation that is
            // dead due to no further uses of the new sym.
            symsRequiringCompensationToMergedValueInfoMap.Add(sym, valueInfo);
        } NEXT_BITSET_IN_SPARSEBV;
        symsRequiringCompensation.ClearAll();
    }

    if (this->isLoopHeader)
    {
        BVSparse<JitArenaAllocator> * tempBv = globOpt->tempBv;
        // Values on the back-edge in the prepass may be conservative for syms defined in the loop, and type specialization in
        // the prepass is not reflective of the value, but rather, is used to determine whether the sym should be specialized
        // around the loop. Additionally, some syms that are used before defined in the loop may be specialized in the loop
        // header despite not being specialized in the landing pad. Now that the type specialization bit-vectors are merged,
        // specialize the corresponding value infos in the loop header too.

        Assert(tempBv->IsEmpty());
        Loop *const loop = this->loop;
        SymTable *const symTable = func->m_symTable;
        JitArenaAllocator *const alloc = globOpt->alloc;

        // Int-specialized syms
        tempBv->Or(loop->likelyIntSymsUsedBeforeDefined, loop->symsDefInLoop);
        tempBv->And(blockData.liveInt32Syms);
        tempBv->Minus(blockData.liveLossyInt32Syms);
        FOREACH_BITSET_IN_SPARSEBV(id, tempBv)
        {
            StackSym *const varSym = symTable->FindStackSym(id);
            Assert(varSym);
            Value *const value = blockData.FindValue(varSym);
            Assert(value);
            ValueInfo *const valueInfo = value->GetValueInfo();
            if(!valueInfo->IsInt())
            {
                globOpt->ChangeValueInfo(nullptr, value, valueInfo->SpecializeToInt32(alloc));
            }
        } NEXT_BITSET_IN_SPARSEBV;

        // Float-specialized syms
        tempBv->Or(loop->likelyNumberSymsUsedBeforeDefined, loop->symsDefInLoop);
        tempBv->Or(loop->forceFloat64SymsOnEntry);
        tempBv->And(blockData.liveFloat64Syms);
        GlobOptBlockData &landingPadBlockData = loop->landingPad->globOptData;
        FOREACH_BITSET_IN_SPARSEBV(id, tempBv)
        {
            StackSym *const varSym = symTable->FindStackSym(id);
            Assert(varSym);

            // If the type-spec sym is null or if the sym is not float-specialized in the loop landing pad, the sym may have
            // been merged to float on a loop back-edge when it was live as float on the back-edge, and live as int in the loop
            // header. In this case, compensation inserted in the loop landing pad will use BailOutNumberOnly, and so it is
            // guaranteed that the value will be float. Otherwise, if the type-spec sym exists, its field can be checked to see
            // if it's prevented from being anything but a number.
            StackSym *const typeSpecSym = varSym->GetFloat64EquivSym(nullptr);
            if(!typeSpecSym ||
                typeSpecSym->m_requiresBailOnNotNumber ||
                !landingPadBlockData.IsFloat64TypeSpecialized(varSym))
            {
                Value *const value = blockData.FindValue(varSym);
                if(value)
                {
                    ValueInfo *const valueInfo = value->GetValueInfo();
                    if(!valueInfo->IsNumber())
                    {
                        globOpt->ChangeValueInfo(this, value, valueInfo->SpecializeToFloat64(alloc));
                    }
                }
                else
                {
                    this->globOptData.SetValue(globOpt->NewGenericValue(ValueType::Float), varSym);
                }
            }
        } NEXT_BITSET_IN_SPARSEBV;
        tempBv->ClearAll();
    }

    // We need to handle the case where a symbol is type-spec'd coming from some predecessors,
    // but not from others.
    //
    // We can do this by inserting the right conversion in the predecessor block, but we
    // can only do this if we are the first successor of that block, since the previous successors
    // would have already been processed.  Instead, we'll need to break the edge and insert a block
    // (airlock block) to put in the conversion code.
    Assert(globOpt->tempBv->IsEmpty());

    BVSparse<JitArenaAllocator> symsNeedingLossyIntConversion(globOpt->tempAlloc);
    BVSparse<JitArenaAllocator> symsNeedingLosslessIntConversion(globOpt->tempAlloc);
    BVSparse<JitArenaAllocator> symsNeedingFloatConversion(globOpt->tempAlloc);

    FOREACH_PREDECESSOR_EDGE_EDITING(edge, this, iter)
    {
        BasicBlock *pred = edge->GetPred();

        if (pred->loop && pred->loop->GetHeadBlock() == this)
        {
            pred->DecrementDataUseCount();
            // Skip loop back-edges. We will handle these when we get to the exit blocks.
            continue;
        }

        BasicBlock *orgPred = nullptr;
        if (pred->isAirLockCompensationBlock)
        {
            Assert(pred->GetPredList()->HasOne());
            orgPred = pred;
            pred = (pred->GetPredList()->Head())->GetPred();
        }

        // Lossy int in the merged block, and no int in the predecessor - need a lossy conversion to int
        symsNeedingLossyIntConversion.Minus(blockData.liveLossyInt32Syms, pred->globOptData.liveInt32Syms);

        // Lossless int in the merged block, and no lossless int in the predecessor - need a lossless conversion to int
        symsNeedingLosslessIntConversion.Minus(blockData.liveInt32Syms, blockData.liveLossyInt32Syms);
        globOpt->tempBv->Minus(pred->globOptData.liveInt32Syms, pred->globOptData.liveLossyInt32Syms);
        symsNeedingLosslessIntConversion.Minus(globOpt->tempBv);

        globOpt->tempBv->Minus(blockData.liveVarSyms, pred->globOptData.liveVarSyms);
        symsNeedingFloatConversion.Minus(blockData.liveFloat64Syms, pred->globOptData.liveFloat64Syms);

        bool symIVNeedsSpecializing = (symIV && !pred->globOptData.liveInt32Syms->Test(symIV->m_id) && !symsNeedingLosslessIntConversion.Test(symIV->m_id));

        if (!globOpt->tempBv->IsEmpty() ||
            !symsNeedingLossyIntConversion.IsEmpty() ||
            !symsNeedingLosslessIntConversion.IsEmpty() ||
            !symsNeedingFloatConversion.IsEmpty() ||
            symIVNeedsSpecializing ||
            symsRequiringCompensationToMergedValueInfoMap.Count() != 0)
        {
            // We can't un-specialize a symbol in a predecessor if we've already processed
            // a successor of that block. Instead, insert a new block on the flow edge
            // (an airlock block) and do the un-specialization there.
            //
            // Alternatively, the current block could be an exit block out of this loop, and so the predecessor may exit the
            // loop. In that case, if the predecessor may continue into the loop without exiting, then we need an airlock block
            // to do the appropriate conversions only on the exit path (preferring not to do the conversions inside the loop).
            // If, on the other hand, the predecessor always flows into the current block, then it always exits, so we don't need
            // an airlock block and can just do the conversions in the predecessor.
            if (pred->GetSuccList()->Head()->GetSucc() != this||
                (pred->loop && pred->loop->parent == this->loop && pred->GetSuccList()->Count() > 1))
            {
                BasicBlock *airlockBlock = nullptr;
                if (!orgPred)
                {
                    if (PHASE_TRACE(Js::GlobOptPhase, this->func) && !globOpt->IsLoopPrePass())
                    {
                        Output::Print(_u("TRACE: "));
                        Output::Print(_u("Inserting airlock block to convert syms to var between block %d and %d\n"),
                            pred->GetBlockNum(), this->GetBlockNum());
                        Output::Flush();
                    }
                    airlockBlock = globOpt->func->m_fg->InsertAirlockBlock(edge);
                }
                else
                {
                    Assert(orgPred->isAirLockCompensationBlock);
                    airlockBlock = orgPred;
                    pred->DecrementDataUseCount();
                    airlockBlock->isAirLockCompensationBlock = false; // This is airlock block now. So remove the attribute.
                }
                globOpt->CloneBlockData(airlockBlock, pred);

                pred = airlockBlock;
            }
            if (!globOpt->tempBv->IsEmpty())
            {
                globOpt->ToVar(globOpt->tempBv, pred);
            }
            if (!symsNeedingLossyIntConversion.IsEmpty())
            {
                globOpt->ToInt32(&symsNeedingLossyIntConversion, pred, true /* lossy */);
            }
            if (!symsNeedingLosslessIntConversion.IsEmpty())
            {
                globOpt->ToInt32(&symsNeedingLosslessIntConversion, pred, false /* lossy */);
            }
            if (!symsNeedingFloatConversion.IsEmpty())
            {
                globOpt->ToFloat64(&symsNeedingFloatConversion, pred);
            }
            if (symIVNeedsSpecializing)
            {
                globOpt->tempBv->ClearAll();
                globOpt->tempBv->Set(symIV->m_id);
                globOpt->ToInt32(globOpt->tempBv, pred, false /* lossy */);
            }
            if(symsRequiringCompensationToMergedValueInfoMap.Count() != 0)
            {
                globOpt->InsertValueCompensation(pred, this, &symsRequiringCompensationToMergedValueInfoMap);
            }
        }
    } NEXT_PREDECESSOR_EDGE_EDITING;

    FOREACH_PREDECESSOR_EDGE(edge, this)
    {
        // Peak Memory optimization:
        // These are in an arena, but putting them on the free list greatly reduces
        // the peak memory used by the global optimizer for complex flow graphs.
        BasicBlock *pred = edge->GetPred();
        if (!this->isLoopHeader || this->loop != pred->loop)
        {
            // Skip airlock compensation block as we are not going to walk this block.
            if (pred->isAirLockCompensationBlock)
            {
                pred->DecrementDataUseCount();
                Assert(pred->GetPredList()->HasOne());
                pred = (pred->GetPredList()->Head())->GetPred();
            }

            if (pred->DecrementDataUseCount() == 0 && (!this->loop || this->loop->landingPad != pred))
            {
                if (!(pred->GetSuccList()->HasOne() && this->GetPredList()->HasOne() && this->loop == nullptr))
                {
                    pred->globOptData.DeleteBlockData();
                }
                else
                {
                    pred->globOptData.NullOutBlockData(globOpt, globOpt->func);
                }
            }
        }
    } NEXT_PREDECESSOR_EDGE;

    globOpt->tempBv->ClearAll();
    Assert(!globOpt->IsLoopPrePass());   // We already early return if we are in prepass

    if (this->isLoopHeader)
    {
        Loop *const loop = this->loop;

        // Save values live on loop entry, such that we can adjust the state of the
        // values on the back-edge to match.
        loop->varSymsOnEntry = JitAnew(globOpt->alloc, BVSparse<JitArenaAllocator>, globOpt->alloc);
        loop->varSymsOnEntry->Copy(this->globOptData.liveVarSyms);

        loop->int32SymsOnEntry = JitAnew(globOpt->alloc, BVSparse<JitArenaAllocator>, globOpt->alloc);
        loop->int32SymsOnEntry->Copy(this->globOptData.liveInt32Syms);

        loop->lossyInt32SymsOnEntry = JitAnew(globOpt->alloc, BVSparse<JitArenaAllocator>, globOpt->alloc);
        loop->lossyInt32SymsOnEntry->Copy(this->globOptData.liveLossyInt32Syms);

        loop->float64SymsOnEntry = JitAnew(globOpt->alloc, BVSparse<JitArenaAllocator>, globOpt->alloc);
        loop->float64SymsOnEntry->Copy(this->globOptData.liveFloat64Syms);

        loop->liveFieldsOnEntry = JitAnew(globOpt->alloc, BVSparse<JitArenaAllocator>, globOpt->alloc);
        loop->liveFieldsOnEntry->Copy(this->globOptData.liveFields);

        if (symsRequiringCompensationToMergedValueInfoMap.Count() != 0)
        {
            loop->symsRequiringCompensationToMergedValueInfoMap = JitAnew(globOpt->alloc, SymToValueInfoMap, globOpt->alloc);
            loop->symsRequiringCompensationToMergedValueInfoMap->Copy(&symsRequiringCompensationToMergedValueInfoMap);
        }
        
        if(globOpt->DoBoundCheckHoist() && loop->inductionVariables)
        {
            globOpt->FinalizeInductionVariables(loop, &blockData);
            if(globOpt->DoLoopCountBasedBoundCheckHoist())
            {
                globOpt->DetermineDominatingLoopCountableBlock(loop, this);
            }
        }
    }
    else if (!this->loop)
    {
        this->SetDataUseCount(this->GetSuccList()->Count());
    }
    else if(this == this->loop->dominatingLoopCountableBlock)
    {
        globOpt->DetermineLoopCount(this->loop);
    }
}